

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Samplers::DefaultsTest::testSamplerFloatVectorParameter
          (DefaultsTest *this,GLenum pname,GLfloat *expected_value)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  float fVar4;
  char *local_1e0 [3];
  MessageBuilder local_1c8;
  float local_48 [2];
  GLfloat value [4];
  Functions *gl;
  GLfloat *expected_value_local;
  DefaultsTest *pDStack_18;
  GLenum pname_local;
  DefaultsTest *this_local;
  
  gl = (Functions *)expected_value;
  expected_value_local._4_4_ = pname;
  pDStack_18 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_48[0] = -1.0;
  local_48[1] = -1.0;
  value[0] = -1.0;
  value[1] = -1.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa48))
            (this->m_sampler_dsa,expected_value_local._4_4_,local_48);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glGetSamplerParameterfv have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessSamplersTests.cpp"
                  ,0x14e);
  fVar4 = de::abs<float>(*(float *)&gl->activeShaderProgram - local_48[0]);
  if (fVar4 <= 0.015625) {
    fVar4 = de::abs<float>(*(float *)((long)&gl->activeShaderProgram + 4) - local_48[1]);
    if (fVar4 <= 0.015625) {
      fVar4 = de::abs<float>(*(float *)&gl->activeTexture - value[0]);
      if (fVar4 <= 0.015625) {
        fVar4 = de::abs<float>(*(float *)((long)&gl->activeTexture + 4) - value[1]);
        if (fVar4 <= 0.015625) {
          return true;
        }
      }
    }
  }
  this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  this_01 = tcu::TestContext::getLog(this_00);
  tcu::TestLog::operator<<(&local_1c8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_1c8,(char (*) [40])"glGetSamplerParameterfv with parameter ");
  local_1e0[0] = glu::getTextureParameterName(expected_value_local._4_4_);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1e0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])" has returned [");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_48);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_48 + 1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,value + 1);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])"], however ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float **)&gl);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [15])0x2a6e9eb);
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c8);
  return false;
}

Assistant:

bool DefaultsTest::testSamplerFloatVectorParameter(glw::GLenum pname, glw::GLfloat expected_value[4])
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get data. */
	glw::GLfloat value[4] = { -1.0, -1.0, -1.0, -1.0 };

	gl.getSamplerParameterfv(m_sampler_dsa, pname, value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetSamplerParameterfv have failed");

	if ((de::abs(expected_value[0] - value[0]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[1] - value[1]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[2] - value[2]) > 0.015625f /* Precision */) ||
		(de::abs(expected_value[3] - value[3]) > 0.015625f /* Precision */))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "glGetSamplerParameterfv with parameter "
											<< glu::getTextureParameterName(pname) << " has returned [" << value[0]
											<< ", " << value[1] << ", " << value[2] << ", " << value[3] << "], however "
											<< expected_value << " was expected." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}